

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RichHdrWrapper.cpp
# Opt level: O2

bool __thiscall RichHdrWrapper::wrap(RichHdrWrapper *this)

{
  RICH_SIGNATURE *richSign;
  RICH_DANS_HEADER *pRVar1;
  size_t sVar2;
  bool bVar3;
  
  richSign = PEFile::getRichHeaderSign((this->super_PEElementWrapper).m_PE);
  this->richSign = richSign;
  pRVar1 = PEFile::getRichHeaderBgn((this->super_PEElementWrapper).m_PE,richSign);
  this->dansHdr = pRVar1;
  bVar3 = this->richSign != (RICH_SIGNATURE *)0x0;
  if (pRVar1 != (RICH_DANS_HEADER *)0x0 && bVar3) {
    sVar2 = compIdCount(this);
  }
  else {
    sVar2 = 0;
  }
  this->compIdCounter = sVar2;
  return pRVar1 != (RICH_DANS_HEADER *)0x0 && bVar3;
}

Assistant:

bool RichHdrWrapper::wrap()
{
    this->richSign = m_PE->getRichHeaderSign();
    this->dansHdr = m_PE->getRichHeaderBgn(richSign);
    if (!this->richSign || !this->dansHdr) {
        this->compIdCounter = 0;
        return false;
    }
    this->compIdCounter = this->compIdCount();
    return true;
}